

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void Mahony_update(quaternion *q)

{
  initializer_list<float> list;
  initializer_list<float> list_00;
  undefined1 local_138 [24];
  matrix<3UL,_1UL> local_120;
  vector<3UL> gyr;
  quaternion local_f0;
  vector<3UL> mag_expect;
  vector<3UL> mag_0;
  matrix<3UL,_1UL> local_a8;
  vector<3UL> mag;
  vector<3UL> acc_expect;
  vector<3UL> acc;
  quaternion local_48;
  
  physical_model::accelerometer();
  blas::vector<3UL>::normalized(&acc,&acc_expect);
  mag_expect.super_matrix<3UL,_1UL>._vptr_matrix = (_func_int **)0x0;
  mag_expect.super_matrix<3UL,_1UL>.data[0][0] = 1.0;
  list._M_len = 3;
  list._M_array = (iterator)&mag_expect;
  blas::quaternion::quaternion((quaternion *)&mag_0,list);
  blas::quaternion::rotate_inv((quaternion *)&mag,q,(quaternion *)&mag_0);
  blas::vector<3UL>::vector(&acc_expect,(quaternion *)&mag);
  physical_model::magnetometer();
  blas::vector<3UL>::normalized(&mag,&mag_0);
  local_f0.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_f0.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107d28;
  local_f0.data.super_matrix<4UL,_1UL>.data[1][0] = mag.super_matrix<3UL,_1UL>.data[0][0];
  local_f0.data.super_matrix<4UL,_1UL>.data[2][0] = mag.super_matrix<3UL,_1UL>.data[1][0];
  local_f0.data.super_matrix<4UL,_1UL>.data[3][0] = mag.super_matrix<3UL,_1UL>.data[2][0];
  blas::quaternion::rotate((quaternion *)&mag_expect,q,&local_f0);
  blas::vector<3UL>::vector(&mag_0,(quaternion *)&mag_expect);
  local_138._4_4_ = 0;
  local_138._0_4_ =
       SQRT(mag_0.super_matrix<3UL,_1UL>.data[0][0] * mag_0.super_matrix<3UL,_1UL>.data[0][0] +
            mag_0.super_matrix<3UL,_1UL>.data[1][0] * mag_0.super_matrix<3UL,_1UL>.data[1][0]);
  local_138._8_4_ = mag_0.super_matrix<3UL,_1UL>.data[2][0];
  list_00._M_len = 3;
  list_00._M_array = (iterator)local_138;
  blas::quaternion::quaternion((quaternion *)&gyr,list_00);
  blas::quaternion::rotate_inv(&local_f0,q,(quaternion *)&gyr);
  blas::vector<3UL>::vector(&mag_expect,&local_f0);
  blas::vector<3UL>::cross((vector<3UL> *)local_138,&acc,&acc_expect);
  blas::vector<3UL>::cross((vector<3UL> *)&local_120,&mag,&mag_expect);
  blas::matrix<3UL,_1UL>::operator+((matrix<3UL,_1UL> *)local_138,&local_120);
  local_f0.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107ce8;
  local_f0.data.super_matrix<4UL,_1UL>.data[0][0] = gyr.super_matrix<3UL,_1UL>.data[0][0];
  local_f0.data.super_matrix<4UL,_1UL>.data[1][0] = gyr.super_matrix<3UL,_1UL>.data[1][0];
  local_f0.data.super_matrix<4UL,_1UL>.data[2][0] = gyr.super_matrix<3UL,_1UL>.data[2][0];
  physical_model::gyroscope();
  blas::vector<3UL>::operator*((vector<3UL> *)&local_120,(vector<3UL> *)&local_f0,0.02);
  blas::vector<3UL>::operator*((vector<3UL> *)local_138,(vector<3UL> *)&local_120,0.01);
  blas::matrix<3UL,_1UL>::operator+=
            (&Mahony_update::integrated_error.super_matrix<3UL,_1UL>,(matrix<3UL,_1UL> *)local_138);
  blas::vector<3UL>::operator*((vector<3UL> *)&local_a8,(vector<3UL> *)&local_f0,120.0);
  blas::matrix<3UL,_1UL>::operator+
            (&Mahony_update::integrated_error.super_matrix<3UL,_1UL>,&local_a8);
  local_138._0_8_ = &PTR_to_string_abi_cxx11__00107ce8;
  local_138._8_4_ = local_120.data[0][0];
  local_138._12_4_ = local_120.data[1][0];
  local_138._16_4_ = local_120.data[2][0];
  blas::matrix<3UL,_1UL>::operator+=(&gyr.super_matrix<3UL,_1UL>,(matrix<3UL,_1UL> *)local_138);
  blas::quaternion::operator*((quaternion *)&local_a8,q,0.5);
  local_48.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_48.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107d28;
  local_48.data.super_matrix<4UL,_1UL>.data[1][0] = gyr.super_matrix<3UL,_1UL>.data[0][0];
  local_48.data.super_matrix<4UL,_1UL>.data[2][0] = gyr.super_matrix<3UL,_1UL>.data[1][0];
  local_48.data.super_matrix<4UL,_1UL>.data[3][0] = gyr.super_matrix<3UL,_1UL>.data[2][0];
  blas::quaternion::operator*((quaternion *)&local_120,(quaternion *)&local_a8,&local_48);
  blas::quaternion::operator*((quaternion *)local_138,(quaternion *)&local_120,0.01);
  blas::quaternion::operator+=(q,(quaternion *)local_138);
  blas::quaternion::normalized((quaternion *)local_138,q);
  *(undefined8 *)(q->data).super_matrix<4UL,_1UL>.data = local_138._8_8_;
  *(ulong *)((q->data).super_matrix<4UL,_1UL>.data + 2) =
       CONCAT44(local_138._20_4_,local_138._16_4_);
  return;
}

Assistant:

void Mahony_update(blas::quaternion &q) {
    using blas::quaternion;
    using blas::vector;
    using blas::matrix;

    const float Kp = 120.0, Ki = 0.02;
    static vector<3> integrated_error;

    const vector<3> acc = physical_model::accelerometer().normalized();
    // Assume the real acceleration is pointing to z+,
    // i.e. there is no accelerated motion.
    const vector<3> acc_expect = q.rotate_inv({0, 0, 1});

    const vector<3> mag = physical_model::magnetometer().normalized();
    const vector<3> mag_0 = q.rotate(mag);
    // Decompose into x-y plane(horizontal) and z-axis(vertical).
    const float mag_h = sqrtf(mag_0(0) * mag_0(0) + mag_0(1) * mag_0(1));
    const float mag_v = mag_0(2);
    // Assume the real direction of magnetic field is in surface y=0, pointing to x+,
    // i.e. there is no electromagnetic interference.
    const vector<3> mag_expect = q.rotate_inv({mag_h, 0, mag_v});

    const vector<3> error = acc.cross(acc_expect) + mag.cross(mag_expect);

    vector<3> gyr = physical_model::gyroscope();
    integrated_error += Ki * error * duration;
    gyr += integrated_error + Kp * error;

    // Approximate the integral
    q += 0.5 * q * gyr * duration;
    q = q.normalized();
}